

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char[9],std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [9],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [13],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_t local_a0;
  char *pcStack_98;
  size_type local_90;
  pointer local_88;
  size_t local_80;
  char (*local_78) [9];
  size_type local_70;
  pointer local_68;
  size_type local_60;
  pointer local_58;
  size_t local_50;
  char (*local_48) [13];
  size_type local_40;
  pointer local_38;
  
  local_b0._M_len = (a->View_)._M_len;
  local_b0._M_str = (a->View_)._M_str;
  local_a0 = (b->View_)._M_len;
  pcStack_98 = (b->View_)._M_str;
  local_88 = (args->_M_dataplus)._M_p;
  local_90 = args->_M_string_length;
  local_80 = strlen(*args_1);
  local_68 = (args_2->_M_dataplus)._M_p;
  local_70 = args_2->_M_string_length;
  local_58 = (args_3->_M_dataplus)._M_p;
  local_60 = args_3->_M_string_length;
  local_78 = args_1;
  local_50 = strlen(*args_4);
  local_48 = args_4;
  local_38 = (args_5->_M_dataplus)._M_p;
  local_40 = args_5->_M_string_length;
  views._M_len = 8;
  views._M_array = &local_b0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}